

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O2

char * cmSourceFileGetProperty(void *arg,char *prop)

{
  cmSourceFile *this;
  int iVar1;
  char *pcVar2;
  allocator local_39;
  string local_38;
  
  this = *arg;
  if (this == (cmSourceFile *)0x0) {
    iVar1 = strcmp(prop,"LOCATION");
    if (iVar1 == 0) {
      return *(char **)((long)arg + 0x48);
    }
    std::__cxx11::string::string((string *)&local_38,prop,&local_39);
    pcVar2 = cmPropertyMap::GetPropertyValue((cmPropertyMap *)((long)arg + 0x80),&local_38);
  }
  else {
    std::__cxx11::string::string((string *)&local_38,prop,&local_39);
    pcVar2 = cmSourceFile::GetProperty(this,&local_38);
  }
  std::__cxx11::string::~string((string *)&local_38);
  return pcVar2;
}

Assistant:

const char * CCONV  cmSourceFileGetProperty(void *arg,const char *prop)
{
  cmCPluginAPISourceFile* sf = static_cast<cmCPluginAPISourceFile*>(arg);
  if(cmSourceFile* rsf = sf->RealSourceFile)
    {
    return rsf->GetProperty(prop);
    }
  else
    {
    if(!strcmp(prop,"LOCATION"))
      {
      return sf->FullPath.c_str();
      }
    return sf->Properties.GetPropertyValue(prop);
    }
}